

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void GA_Lu_solve(char tran,int g_a,int g_b)

{
  pnga_lu_solve_alt((ulong)((tran & 0xdfU) == 0x54),(long)g_a,(long)g_b);
  return;
}

Assistant:

void GA_Lu_solve(char tran, int g_a, int g_b)
{
    Integer a = (Integer)g_a;
    Integer b = (Integer)g_b;

    Integer t;

    if(tran == 't' || tran == 'T') t = 1;
    else t = 0;

    wnga_lu_solve_alt(t, a, b);
}